

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

void __thiscall Company::Company(Company *this,Company *obj)

{
  int iVar1;
  Boss *this_00;
  Employee **ppEVar2;
  Employee *this_01;
  ulong uVar3;
  long lVar4;
  
  this->budget = obj->budget;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,obj->boss);
  this->boss = this_00;
  iVar1 = Boss::getNumberOfEmployees(obj->boss);
  uVar3 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar3 = (long)iVar1 * 8;
  }
  ppEVar2 = (Employee **)operator_new__(uVar3);
  this->employees = ppEVar2;
  iVar1 = Boss::getNumberOfEmployees(obj->boss);
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      this_01 = (Employee *)operator_new(0xb8);
      Employee::Employee(this_01,obj->employees[lVar4]);
      this->employees[lVar4] = this_01;
      lVar4 = lVar4 + 1;
      iVar1 = Boss::getNumberOfEmployees(obj->boss);
    } while (lVar4 < iVar1);
  }
  return;
}

Assistant:

Company::Company(const Company &obj) {
    this->budget = obj.budget;
    this->boss = new Boss(*obj.boss);
    this->employees = new Employee *[obj.boss->getNumberOfEmployees()];
    for (int i = 0; i < obj.boss->getNumberOfEmployees(); ++i) {
        this->employees[i] = new Employee(*obj.employees[i]);
    }
}